

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void Glucose_SolveCnf(char *pFileName,Glucose_Pars *pPars)

{
  bool bVar1;
  abctime aVar2;
  abctime aVar3;
  long lVar4;
  abctime time;
  abctime time_00;
  char *__format;
  lbool ret;
  vec<Gluco::Lit> dummy;
  SimpSolver S;
  
  aVar2 = Abc_Clock();
  Gluco::SimpSolver::SimpSolver(&S);
  S.super_Solver.verbosity = pPars->verb;
  lVar4 = -1;
  if (0 < (long)pPars->nConfls) {
    lVar4 = (long)pPars->nConfls;
  }
  S.super_Solver.conflict_budget = lVar4 + S.super_Solver.conflicts;
  Glucose_ReadDimacs(pFileName,&S);
  if (pPars->verb != 0) {
    puts("c ============================[ Problem Statistics ]=============================");
    puts("c |                                                                             |");
    printf("c |  Number of variables:  %12d                                         |\n",
           (ulong)(uint)S.super_Solver.vardata.sz);
    printf("c |  Number of clauses:    %12d                                         |\n",
           (ulong)(uint)S.super_Solver.clauses.sz);
  }
  if (pPars->pre != 0) {
    Gluco::SimpSolver::eliminate(&S,true);
    printf("c Simplication removed %d variables and %d clauses.  ",(ulong)(uint)S.eliminated_vars,
           (ulong)(uint)S.eliminated_clauses);
    aVar3 = Abc_Clock();
    Abc_PrintTime(0x816bba,(char *)(aVar3 - aVar2),time);
  }
  dummy.data = (Lit *)0x0;
  dummy.sz = 0;
  dummy.cap = 0;
  ret = Gluco::SimpSolver::solveLimited(&S,&dummy,false,false);
  if (pPars->verb != 0) {
    aVar3 = Abc_Clock();
    glucose_print_stats(&S,aVar3 - aVar2);
  }
  bVar1 = Gluco::lbool::operator==(&ret,(lbool)0x0);
  if (bVar1) {
    __format = "SATISFIABLE";
  }
  else {
    bVar1 = Gluco::lbool::operator==(&ret,(lbool)0x1);
    __format = "INDETERMINATE";
    if (bVar1) {
      __format = "UNSATISFIABLE";
    }
  }
  printf(__format);
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x816bb4,(char *)(aVar3 - aVar2),time_00);
  Gluco::vec<Gluco::Lit>::~vec(&dummy);
  Gluco::SimpSolver::~SimpSolver(&S);
  return;
}

Assistant:

void Glucose_SolveCnf( char * pFileName, Glucose_Pars * pPars )
{
    abctime clk = Abc_Clock();

    SimpSolver  S;
    S.verbosity = pPars->verb;
    S.setConfBudget( pPars->nConfls > 0 ? (int64_t)pPars->nConfls : -1 );

//    gzFile in = gzopen(pFilename, "rb");
//    parse_DIMACS(in, S);
//    gzclose(in);
    Glucose_ReadDimacs( pFileName, S );

    if ( pPars->verb )
    {
        printf("c ============================[ Problem Statistics ]=============================\n");
        printf("c |                                                                             |\n");
        printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
        printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
    }
    
    if ( pPars->pre ) 
    {
        S.eliminate(true);
        printf( "c Simplication removed %d variables and %d clauses.  ", S.eliminated_vars, S.eliminated_clauses );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    vec<Lit> dummy;
    lbool ret = S.solveLimited(dummy, 0);
    if ( pPars->verb ) glucose_print_stats(S, Abc_Clock() - clk);
    printf(ret == l_True ? "SATISFIABLE" : ret == l_False ? "UNSATISFIABLE" : "INDETERMINATE");
    Abc_PrintTime( 1, "      Time", Abc_Clock() - clk );
}